

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O0

bool upb_Message_SetExtensionInt32
               (upb_Message *msg,upb_MiniTableExtension *e,int32_t value,upb_Arena *a)

{
  upb_CType uVar1;
  upb_FieldRep uVar2;
  bool bVar3;
  upb_Arena *a_local;
  upb_MiniTableExtension *puStack_18;
  int32_t value_local;
  upb_MiniTableExtension *e_local;
  upb_Message *msg_local;
  
  a_local._4_4_ = value;
  puStack_18 = e;
  e_local = (upb_MiniTableExtension *)msg;
  uVar1 = upb_MiniTableExtension_CType(e);
  bVar3 = true;
  if (uVar1 != kUpb_CType_Int32) {
    uVar1 = upb_MiniTableExtension_CType(puStack_18);
    bVar3 = uVar1 == kUpb_CType_Enum;
  }
  if (!bVar3) {
    __assert_fail("upb_MiniTableExtension_CType(e) == kUpb_CType_Int32 || upb_MiniTableExtension_CType(e) == kUpb_CType_Enum"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x2d2,
                  "bool upb_Message_SetExtensionInt32(struct upb_Message *, const upb_MiniTableExtension *, int32_t, upb_Arena *)"
                 );
  }
  uVar2 = _upb_MiniTableExtension_GetRep_dont_copy_me__upb_internal_use_only(puStack_18);
  if (uVar2 == kUpb_FieldRep_4Byte) {
    bVar3 = upb_Message_SetExtension
                      ((upb_Message *)e_local,puStack_18,(void *)((long)&a_local + 4),a);
    return bVar3;
  }
  __assert_fail("_upb_MiniTableExtension_GetRep_dont_copy_me__upb_internal_use_only(e) == kUpb_FieldRep_4Byte"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                ,0x2d4,
                "bool upb_Message_SetExtensionInt32(struct upb_Message *, const upb_MiniTableExtension *, int32_t, upb_Arena *)"
               );
}

Assistant:

UPB_API_INLINE bool upb_Message_SetExtensionInt32(
    struct upb_Message* msg, const upb_MiniTableExtension* e, int32_t value,
    upb_Arena* a) {
  UPB_ASSUME(upb_MiniTableExtension_CType(e) == kUpb_CType_Int32 ||
             upb_MiniTableExtension_CType(e) == kUpb_CType_Enum);
  UPB_ASSUME(UPB_PRIVATE(_upb_MiniTableExtension_GetRep)(e) ==
             kUpb_FieldRep_4Byte);
  return upb_Message_SetExtension(msg, e, &value, a);
}